

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

void req0_pipe_stop(void *arg)

{
  nni_mtx *mtx;
  
  mtx = (nni_mtx *)(*(long *)((long)arg + 8) + 0x358);
  nni_aio_stop((nni_aio *)((long)arg + 0x208));
  nni_aio_stop((nni_aio *)((long)arg + 0x40));
  nni_mtx_lock(mtx);
  nni_list_node_remove((nni_list_node *)((long)arg + 0x10));
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
req0_pipe_stop(void *arg)
{
	req0_pipe *p = arg;
	req0_sock *s = p->req;

	nni_aio_stop(&p->aio_recv);
	nni_aio_stop(&p->aio_send);
	nni_mtx_lock(&s->mtx);
	nni_list_node_remove(&p->node);
	nni_mtx_unlock(&s->mtx);
}